

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Concat_x86::forward
          (Concat_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  const_reference pvVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  int *piVar4;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar5;
  float *ptr_6;
  int size_4;
  Mat *bottom_blob_13;
  size_t b_13;
  float *outptr_6;
  int q_3;
  Mat *top_blob_6;
  Mat *bottom_blob_12;
  size_t b_12;
  int top_d;
  int elempack_6;
  size_t elemsize_6;
  int channels_2;
  int h_3;
  int w_3;
  float *ptr_5;
  Mat *bottom_blob_11;
  size_t b_11;
  int j_1;
  int i_4;
  float *outptr_5;
  int q_2;
  Mat *top_blob_5;
  Mat *bottom_blob_10;
  size_t b_10;
  int top_w_2;
  int elempack_5;
  size_t elemsize_5;
  int channels_1;
  int d_2;
  int h_2;
  float *ptr_4;
  int size_3;
  Mat *bottom_blob_9;
  size_t b_9;
  int i_3;
  float *outptr_4;
  int q_1;
  Mat *top_blob_4;
  Mat *bottom_blob_8;
  size_t b_8;
  int top_h_1;
  int elempack_4;
  size_t elemsize_4;
  int channels;
  int d_1;
  int w_2;
  float *outptr_3;
  float *ptr_3;
  int size_2;
  int i_2;
  float *outptr3_1;
  float *outptr2_1;
  float *outptr1_1;
  float *outptr0_1;
  float *r0_1;
  int q;
  int size_1;
  Mat *bottom_blob_7;
  size_t b_7;
  int p;
  Mat top_blob_unpacked_1;
  Mat *top_blob_3;
  size_t out_elemsize_2;
  int out_elempack_2;
  Mat *bottom_blob_6;
  size_t b_6;
  int top_channels;
  int elempack_3;
  size_t elemsize_3;
  int d;
  int h_1;
  int w_1;
  float *ptr_2;
  Mat *bottom_blob_5;
  size_t b_5;
  float *outptr_2;
  int i_1;
  Mat *top_blob_2;
  Mat *bottom_blob_4;
  size_t b_4;
  int top_w_1;
  int elempack_2;
  size_t elemsize_2;
  int h;
  float *ptr_1;
  int size;
  int j;
  float *outptr3;
  float *outptr2;
  float *outptr1;
  float *outptr0;
  float *r0;
  int i;
  Mat *bottom_blob_3;
  size_t b_3;
  float *outptr_1;
  Mat top_blob_unpacked;
  Mat *top_blob_1;
  size_t out_elemsize_1;
  int out_elempack_1;
  Mat *bottom_blob_2;
  size_t b_2;
  int top_h;
  int elempack_1;
  size_t elemsize_1;
  int w;
  float *ptr;
  Mat *bottom_blob_1;
  size_t b_1;
  float *outptr;
  Mat *top_blob;
  size_t out_elemsize;
  int out_elempack;
  Mat *bottom_blob;
  size_t b;
  int top_w;
  int elempack;
  size_t elemsize;
  int positive_axis;
  int dims;
  Mat *m_11;
  Mat *m_9;
  Mat *m_7;
  Mat *m;
  Mat *m_10;
  Mat *m_8;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  size_t in_stack_ffffffffffffe848;
  Allocator *in_stack_ffffffffffffe850;
  undefined8 in_stack_ffffffffffffe858;
  Mat *in_stack_ffffffffffffe860;
  Option *in_stack_ffffffffffffe868;
  Mat *in_stack_ffffffffffffe870;
  ulong uVar6;
  Mat *in_stack_ffffffffffffe878;
  Mat *in_stack_ffffffffffffe880;
  int _elempack;
  undefined8 *in_stack_ffffffffffffe8c0;
  Allocator *in_stack_ffffffffffffe8c8;
  int local_1424;
  undefined8 local_1418;
  undefined8 local_1410;
  undefined8 local_1408;
  undefined4 local_1400;
  Allocator *local_13f8;
  undefined4 local_13f0;
  undefined4 local_13ec;
  undefined4 local_13e8;
  undefined4 local_13e4;
  undefined4 local_13e0;
  undefined8 local_13d8;
  void *local_13d0;
  int local_13c4;
  const_reference local_13c0;
  ulong local_13b8;
  undefined8 local_13b0;
  undefined8 local_13a8;
  undefined8 local_13a0;
  undefined4 local_1398;
  Allocator *local_1390;
  undefined4 local_1388;
  undefined4 local_1384;
  undefined4 local_1380;
  undefined4 local_137c;
  undefined4 local_1378;
  undefined8 local_1370;
  void *local_1368;
  int local_135c;
  reference local_1358;
  const_reference local_1350;
  ulong local_1348;
  int local_1340;
  int local_133c;
  size_t local_1338;
  int local_132c;
  int local_1328;
  int local_1324;
  undefined8 local_1320;
  undefined8 local_1318;
  undefined8 local_1310;
  undefined4 local_1308;
  Allocator *local_1300;
  undefined4 local_12f8;
  undefined4 local_12f4;
  undefined4 local_12f0;
  undefined4 local_12ec;
  undefined4 local_12e8;
  undefined8 local_12e0;
  undefined8 local_12d8;
  undefined8 local_12d0;
  undefined8 local_12c8;
  undefined4 local_12c0;
  Allocator *local_12b8;
  undefined4 local_12b0;
  undefined4 local_12ac;
  undefined4 local_12a8;
  undefined4 local_12a4;
  undefined4 local_12a0;
  undefined8 local_1298;
  Allocator *local_1290;
  const_reference local_1288;
  ulong local_1280;
  int local_1278;
  int local_1274;
  undefined8 local_1270;
  undefined8 local_1268;
  undefined8 local_1260;
  undefined4 local_1258;
  Allocator *local_1250;
  undefined4 local_1248;
  undefined4 local_1244;
  undefined4 local_1240;
  undefined4 local_123c;
  undefined4 local_1238;
  undefined8 local_1230;
  void *local_1228;
  int local_121c;
  reference local_1218;
  const_reference local_1210;
  ulong local_1208;
  int local_1200;
  int local_11fc;
  size_t local_11f8;
  int local_11ec;
  int local_11e8;
  int local_11e4;
  undefined8 local_11e0;
  undefined8 local_11d8;
  undefined8 local_11d0;
  undefined4 local_11c8;
  Allocator *local_11c0;
  undefined4 local_11b8;
  undefined4 local_11b4;
  undefined4 local_11b0;
  undefined4 local_11ac;
  undefined4 local_11a8;
  undefined8 local_11a0;
  undefined8 local_1198;
  undefined8 local_1190;
  undefined8 local_1188;
  undefined4 local_1180;
  Allocator *local_1178;
  undefined4 local_1170;
  undefined4 local_116c;
  undefined4 local_1168;
  undefined4 local_1164;
  undefined4 local_1160;
  undefined8 local_1158;
  void *local_1150;
  int local_1144;
  const_reference local_1140;
  ulong local_1138;
  int local_112c;
  undefined8 local_1128;
  undefined8 local_1120;
  undefined8 local_1118;
  undefined4 local_1110;
  Allocator *local_1108;
  undefined4 local_1100;
  undefined4 local_10fc;
  undefined4 local_10f8;
  undefined4 local_10f4;
  undefined4 local_10f0;
  undefined8 local_10e8;
  void *local_10e0;
  int local_10d4;
  reference local_10d0;
  const_reference local_10c8;
  ulong local_10c0;
  int local_10b8;
  int local_10b4;
  size_t local_10b0;
  int local_10a4;
  int local_10a0;
  int local_109c;
  undefined8 local_1098;
  undefined8 local_1090;
  undefined8 local_1088;
  undefined4 local_1080;
  Allocator *local_1078;
  undefined4 local_1070;
  undefined4 local_106c;
  undefined4 local_1068;
  undefined4 local_1064;
  undefined4 local_1060;
  undefined8 local_1058;
  void *local_1050;
  void *local_1048;
  int local_1040;
  int local_103c;
  undefined8 local_1038;
  undefined8 local_1030;
  undefined8 local_1028;
  undefined4 local_1020;
  Allocator *local_1018;
  undefined4 local_1010;
  undefined4 local_100c;
  undefined4 local_1008;
  undefined4 local_1004;
  undefined4 local_1000;
  undefined8 local_ff8;
  undefined4 *local_ff0;
  undefined8 local_fe8;
  undefined8 local_fe0;
  undefined8 local_fd8;
  undefined4 local_fd0;
  Allocator *local_fc8;
  undefined4 local_fc0;
  undefined4 local_fbc;
  undefined4 local_fb8;
  undefined4 local_fb4;
  undefined4 local_fb0;
  undefined8 local_fa8;
  undefined4 *local_fa0;
  undefined8 local_f98;
  undefined8 local_f90;
  undefined8 local_f88;
  undefined4 local_f80;
  Allocator *local_f78;
  undefined4 local_f70;
  undefined4 local_f6c;
  undefined4 local_f68;
  undefined4 local_f64;
  undefined4 local_f60;
  undefined8 local_f58;
  undefined4 *local_f50;
  undefined8 local_f48;
  undefined8 local_f40;
  undefined8 local_f38;
  undefined4 local_f30;
  Allocator *local_f28;
  undefined4 local_f20;
  undefined4 local_f1c;
  undefined4 local_f18;
  undefined4 local_f14;
  undefined4 local_f10;
  undefined8 local_f08;
  undefined4 *local_f00;
  undefined8 local_ef8;
  undefined8 local_ef0;
  undefined8 local_ee8;
  undefined4 local_ee0;
  Allocator *local_ed8;
  undefined4 local_ed0;
  undefined4 local_ecc;
  undefined4 local_ec8;
  undefined4 local_ec4;
  undefined4 local_ec0;
  undefined8 local_eb8;
  undefined4 *local_eb0;
  int local_ea8;
  int local_ea4;
  const_reference local_ea0;
  ulong local_e98;
  int local_e8c;
  void *local_e88;
  int *local_e80;
  size_t local_e78;
  int local_e70;
  Allocator *local_e68;
  int local_e60;
  int local_e5c;
  int local_e58;
  int local_e54;
  int local_e50;
  size_t local_e48;
  reference local_e40;
  long local_e38;
  int local_e2c;
  const_reference local_e28;
  ulong local_e20;
  int local_e18;
  int local_e14;
  size_t local_e10;
  int local_e04;
  int local_e00;
  int local_dfc;
  void *local_df8;
  const_reference local_df0;
  ulong local_de8;
  void *local_de0;
  int local_dd4;
  reference local_dd0;
  const_reference local_dc8;
  ulong local_dc0;
  int local_db8;
  int local_db4;
  size_t local_db0;
  int local_da4;
  void *local_da0;
  int local_d98;
  int local_d94;
  undefined4 *local_d90;
  undefined4 *local_d88;
  undefined4 *local_d80;
  undefined4 *local_d78;
  undefined4 *local_d70;
  int local_d64;
  const_reference local_d60;
  ulong local_d58;
  undefined4 *local_d50;
  int local_d48;
  undefined4 *local_d38;
  int *local_d30;
  size_t local_d28;
  int local_d20;
  Allocator *local_d18;
  int local_d10;
  int local_d0c;
  int local_d08;
  int local_d04;
  int local_d00;
  size_t local_cf8;
  reference local_cf0;
  long local_ce8;
  int local_cdc;
  const_reference local_cd8;
  ulong local_cd0;
  int local_cc8;
  int local_cc4;
  size_t local_cc0;
  int local_cb4;
  void *local_cb0;
  const_reference local_ca8;
  ulong local_ca0;
  void *local_c98;
  reference local_c90;
  long local_c88;
  int local_c7c;
  const_reference local_c78;
  ulong local_c70;
  int local_c68;
  int local_c64;
  size_t local_c60;
  int local_c58;
  int local_c54;
  long local_c50;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_c48;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_c40;
  int local_c2c;
  reference local_c28;
  reference local_c20;
  reference local_c18;
  void **local_c10;
  reference local_c08;
  reference local_c00;
  undefined4 **local_bf8;
  reference local_bf0;
  reference local_be8;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  undefined8 *local_bc8;
  undefined8 *local_bc0;
  undefined8 *local_bb8;
  undefined8 *local_bb0;
  undefined8 *local_ba8;
  undefined4 **local_ba0;
  reference local_b98;
  undefined8 *local_b90;
  undefined8 *local_b88;
  const_reference local_b80;
  undefined8 *local_b78;
  const_reference local_b70;
  const_reference local_b68;
  reference local_b60;
  undefined4 **local_b58;
  reference local_b50;
  void **local_b48;
  int local_b3c;
  undefined8 *local_b38;
  int local_b2c;
  const_reference local_b28;
  int local_b1c;
  const_reference local_b18;
  undefined4 **local_b10;
  undefined8 *local_b00;
  undefined8 *local_af0;
  undefined8 *local_ae0;
  undefined8 *local_ad0;
  undefined8 *local_ac0;
  undefined8 *local_ab0;
  void **local_aa0;
  undefined8 *local_a90;
  undefined8 *local_a80;
  undefined8 *local_a70;
  undefined8 *local_a60;
  undefined8 *local_a50;
  undefined8 *local_a40;
  undefined8 *local_a30;
  undefined8 *local_a20;
  int local_a0c;
  reference local_a08;
  undefined1 local_9fd;
  int local_9fc;
  const_reference local_9f8;
  undefined8 *local_9f0;
  undefined1 local_9dd;
  int local_9dc;
  const_reference local_9d8;
  undefined8 *local_9d0;
  undefined1 local_9bd;
  int local_9bc;
  const_reference local_9b8;
  undefined8 *local_9b0;
  undefined1 local_99d;
  int local_99c;
  const_reference local_998;
  undefined8 *local_990;
  undefined1 local_97d;
  int local_97c;
  reference local_978;
  undefined8 *local_970;
  undefined1 local_95d;
  int local_95c;
  reference local_958;
  undefined8 *local_950;
  undefined1 local_93d;
  int local_93c;
  reference local_938;
  undefined8 *local_930;
  undefined1 local_91d;
  int local_91c;
  void **local_918;
  undefined8 *local_910;
  undefined1 local_8fd;
  int local_8fc;
  void **local_8f8;
  undefined8 *local_8f0;
  undefined1 local_8dd;
  int local_8dc;
  void **local_8d8;
  undefined8 *local_8d0;
  undefined1 local_8bd;
  int local_8bc;
  void **local_8b8;
  undefined8 *local_8b0;
  undefined1 local_89d;
  int local_89c;
  void **local_898;
  undefined8 *local_890;
  reference local_880;
  reference local_878;
  undefined4 **local_870;
  reference local_868;
  reference local_860;
  void **local_858;
  reference local_850;
  reference local_848;
  reference local_840;
  const_reference local_838;
  int local_82c;
  undefined8 *local_828;
  undefined8 *local_820;
  int local_814;
  undefined8 *local_810;
  undefined8 *local_808;
  int local_800;
  undefined4 local_7fc;
  void **local_7f8;
  int local_7f0;
  undefined4 local_7ec;
  undefined4 **local_7e8;
  undefined8 *local_708;
  undefined8 *local_6e8;
  undefined8 *local_6c8;
  undefined8 *local_6a8;
  undefined8 *local_688;
  undefined8 *local_668;
  undefined8 *local_648;
  undefined8 *local_628;
  int local_610;
  undefined4 local_60c;
  void **local_608;
  undefined8 *local_5e8;
  undefined8 *local_5c8;
  undefined8 *local_5a8;
  undefined8 *local_588;
  undefined8 *local_568;
  undefined8 *local_548;
  int local_530;
  undefined4 local_52c;
  undefined4 **local_528;
  undefined4 *local_520;
  void *local_4b0;
  Allocator *local_3c0;
  int local_3b4;
  size_t local_3b0;
  undefined4 *local_3a8;
  int local_39c;
  int local_398;
  int local_394;
  undefined8 *local_390;
  Allocator *local_388;
  int local_37c;
  size_t local_378;
  undefined4 *local_370;
  int local_364;
  int local_360;
  int local_35c;
  undefined8 *local_358;
  Allocator *local_350;
  int local_344;
  size_t local_340;
  undefined4 *local_338;
  int local_32c;
  int local_328;
  int local_324;
  undefined8 *local_320;
  Allocator *local_318;
  int local_30c;
  size_t local_308;
  undefined4 *local_300;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  undefined8 *local_2e8;
  Allocator *local_2e0;
  int local_2d4;
  size_t local_2d0;
  void *local_2c8;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  undefined8 *local_2b0;
  Allocator *local_2a8;
  int local_29c;
  size_t local_298;
  void *local_290;
  int local_284;
  int local_280;
  int local_27c;
  undefined8 *local_278;
  Allocator *local_270;
  int local_264;
  size_t local_260;
  void *local_258;
  int local_24c;
  int local_248;
  int local_244;
  undefined8 *local_240;
  Allocator *local_238;
  int local_22c;
  size_t local_228;
  void *local_220;
  int local_214;
  int local_210;
  int local_20c;
  undefined8 *local_208;
  Allocator *local_200;
  int local_1f4;
  size_t local_1f0;
  undefined4 *local_1e8;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  undefined8 *local_1d0;
  Allocator *local_1c8;
  int local_1bc;
  size_t local_1b8;
  void *local_1b0;
  int local_1a4;
  int local_1a0;
  int local_19c;
  undefined8 *local_198;
  Allocator *local_190;
  int local_184;
  size_t local_180;
  void *local_178;
  int local_16c;
  int local_168;
  int local_164;
  undefined8 *local_160;
  Allocator *local_158;
  int local_14c;
  size_t local_148;
  void *local_140;
  int local_134;
  int local_130;
  int local_12c;
  undefined8 *local_128;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  Allocator *local_60;
  int local_54;
  size_t local_50;
  void *local_48;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  Allocator *local_30;
  int local_24;
  size_t local_20;
  void *local_18;
  int local_10;
  int local_c;
  undefined8 *local_8;
  
  local_c50 = in_RCX;
  local_c48 = in_RDX;
  local_c40 = in_RSI;
  pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_c54 = pvVar1->dims;
  if (*(int *)(in_RDI + 0xd0) < 0) {
    local_1424 = local_c54 + *(int *)(in_RDI + 0xd0);
  }
  else {
    local_1424 = *(int *)(in_RDI + 0xd0);
  }
  local_c58 = local_1424;
  if (local_c54 == 1) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_c60 = pvVar1->elemsize;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_c64 = pvVar1->elempack;
    local_c68 = 0;
    for (local_c70 = 0; uVar6 = local_c70,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c40), uVar6 < sVar2;
        local_c70 = local_c70 + 1) {
      local_c78 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_c40,local_c70);
      local_c68 = local_c78->w * local_c78->elempack + local_c68;
    }
    local_c7c = 1;
    if (((*(byte *)(local_c50 + 0x27) & 1) != 0) && (local_c7c = 1, local_c68 % 4 == 0)) {
      local_c7c = 4;
    }
    local_c88 = (local_c60 / (ulong)(long)local_c64) * (long)local_c7c;
    local_c90 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c48,0);
    Mat::create(in_stack_ffffffffffffe870,(int)((ulong)in_stack_ffffffffffffe868 >> 0x20),
                (size_t)in_stack_ffffffffffffe860,(int)((ulong)in_stack_ffffffffffffe858 >> 0x20),
                in_stack_ffffffffffffe850);
    local_be8 = local_c90;
    bVar5 = true;
    if (local_c90->data != (void *)0x0) {
      local_880 = local_c90;
      bVar5 = local_c90->cstep * (long)local_c90->c == 0;
    }
    if (bVar5) {
      return -100;
    }
    local_b98 = local_c90;
    local_c98 = local_c90->data;
    for (local_ca0 = 0; uVar6 = local_ca0,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c40), uVar6 < sVar2;
        local_ca0 = local_ca0 + 1) {
      local_ca8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_c40,local_ca0);
      local_cb0 = local_ca8->data;
      local_b68 = local_ca8;
      memcpy(local_c98,local_cb0,(long)local_ca8->w * local_ca8->elemsize);
      local_c98 = (void *)((long)local_c98 + (long)(local_ca8->w * local_ca8->elempack) * 4);
    }
  }
  if ((local_c54 == 2) && (local_c58 == 0)) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_cb4 = pvVar1->w;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_cc0 = pvVar1->elemsize;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_cc4 = pvVar1->elempack;
    local_cc8 = 0;
    for (local_cd0 = 0; uVar6 = local_cd0,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c40), uVar6 < sVar2;
        local_cd0 = local_cd0 + 1) {
      local_cd8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_c40,local_cd0);
      puVar3 = std::min<unsigned_long>(&local_cc0,&local_cd8->elemsize);
      local_cc0 = *puVar3;
      piVar4 = std::min<int>(&local_cc4,&local_cd8->elempack);
      local_cc4 = *piVar4;
      local_cc8 = local_cd8->h * local_cd8->elempack + local_cc8;
    }
    local_cdc = 1;
    if (((*(byte *)(local_c50 + 0x27) & 1) != 0) && (local_cdc = 1, local_cc8 % 4 == 0)) {
      local_cdc = 4;
    }
    local_ce8 = (local_cc0 / (ulong)(long)local_cc4) * (long)local_cdc;
    local_cf0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c48,0);
    Mat::create(in_stack_ffffffffffffe870,(int)((ulong)in_stack_ffffffffffffe868 >> 0x20),
                (int)in_stack_ffffffffffffe868,(size_t)in_stack_ffffffffffffe860,
                (int)((ulong)in_stack_ffffffffffffe858 >> 0x20),in_stack_ffffffffffffe850);
    local_bf0 = local_cf0;
    bVar5 = true;
    if (local_cf0->data != (void *)0x0) {
      local_878 = local_cf0;
      bVar5 = local_cf0->cstep * (long)local_cf0->c == 0;
    }
    if (bVar5) {
      return -100;
    }
    local_b58 = &local_d38;
    local_b60 = local_cf0;
    local_d38 = (undefined4 *)local_cf0->data;
    local_d30 = local_cf0->refcount;
    local_d28 = local_cf0->elemsize;
    local_d20 = local_cf0->elempack;
    local_d18 = local_cf0->allocator;
    local_d10 = local_cf0->dims;
    local_d0c = local_cf0->w;
    local_d08 = local_cf0->h;
    local_d04 = local_cf0->d;
    local_d00 = local_cf0->c;
    local_cf8 = local_cf0->cstep;
    if (local_d30 != (int *)0x0) {
      local_7ec = 1;
      LOCK();
      local_7f0 = *local_d30;
      *local_d30 = *local_d30 + 1;
      UNLOCK();
    }
    local_7e8 = local_b58;
    if (local_cc4 < local_cdc) {
      Mat::create(in_stack_ffffffffffffe870,(int)((ulong)in_stack_ffffffffffffe868 >> 0x20),
                  (int)in_stack_ffffffffffffe868,(size_t)in_stack_ffffffffffffe860,
                  (int)((ulong)in_stack_ffffffffffffe858 >> 0x20),in_stack_ffffffffffffe850);
      local_bf8 = &local_d38;
      if (local_d38 != (undefined4 *)0x0) {
        local_870 = local_bf8;
      }
      if (local_d38 != (undefined4 *)0x0 && local_cf8 * (long)local_d00 != 0) goto LAB_001a256b;
      local_c2c = -100;
      local_d48 = 1;
    }
    else {
LAB_001a256b:
      local_ba0 = &local_d38;
      local_d50 = local_d38;
      for (local_d58 = 0; uVar6 = local_d58,
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c40), uVar6 < sVar2
          ; local_d58 = local_d58 + 1) {
        local_d60 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_c40,local_d58);
        if ((local_d60->elempack == 4) && (local_cc4 == 1)) {
          for (local_d64 = 0; local_d64 < local_d60->h; local_d64 = local_d64 + 1) {
            local_b1c = local_d64;
            local_d70 = (undefined4 *)
                        ((long)local_d60->data +
                        (long)local_d60->w * (long)local_d64 * local_d60->elemsize);
            local_d78 = local_d50;
            local_d90 = local_d50 + local_cb4 * 3;
            local_d88 = local_d50 + (local_cb4 << 1);
            local_d80 = local_d50 + local_cb4;
            for (local_d94 = 0; local_d94 < local_cb4; local_d94 = local_d94 + 1) {
              *local_d78 = *local_d70;
              *local_d80 = local_d70[1];
              *local_d88 = local_d70[2];
              *local_d90 = local_d70[3];
              local_d70 = local_d70 + 4;
              local_d90 = local_d90 + 1;
              local_d88 = local_d88 + 1;
              local_d80 = local_d80 + 1;
              local_d78 = local_d78 + 1;
            }
            local_d50 = local_d50 + (local_cb4 << 2);
            local_b18 = local_d60;
          }
        }
        if (local_d60->elempack == local_cc4) {
          local_d98 = local_cb4 * local_d60->h;
          local_da0 = local_d60->data;
          local_b70 = local_d60;
          memcpy(local_d50,local_da0,(long)local_d98 * local_d60->elemsize);
          local_d50 = local_d50 + local_d98 * local_d60->elempack;
        }
      }
      if (local_cc4 < local_cdc) {
        convert_packing(in_stack_ffffffffffffe880,in_stack_ffffffffffffe878,
                        (int)((ulong)in_stack_ffffffffffffe870 >> 0x20),in_stack_ffffffffffffe868);
      }
      local_d48 = 0;
    }
    local_b10 = &local_d38;
    local_528 = local_b10;
    if (local_d30 != (int *)0x0) {
      local_52c = 0xffffffff;
      LOCK();
      local_530 = *local_d30;
      *local_d30 = *local_d30 + -1;
      UNLOCK();
      if (local_530 == 1) {
        if (local_d18 == (Allocator *)0x0) {
          local_520 = local_d38;
          if (local_d38 != (undefined4 *)0x0) {
            free(local_d38);
          }
        }
        else {
          (*local_d18->_vptr_Allocator[3])(local_d18,local_d38);
        }
      }
    }
    local_d38 = (undefined4 *)0x0;
    local_d28 = 0;
    local_d20 = 0;
    local_d10 = 0;
    local_d0c = 0;
    local_d08 = 0;
    local_d04 = 0;
    local_d00 = 0;
    local_cf8 = 0;
    local_d30 = (int *)0x0;
    if (local_d48 != 0) {
      return local_c2c;
    }
  }
  if ((local_c54 == 2) && (local_c58 == 1)) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_da4 = pvVar1->h;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_db0 = pvVar1->elemsize;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_db4 = pvVar1->elempack;
    local_db8 = 0;
    for (local_dc0 = 0; uVar6 = local_dc0,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c40), uVar6 < sVar2;
        local_dc0 = local_dc0 + 1) {
      local_dc8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_c40,local_dc0);
      local_db8 = local_dc8->w + local_db8;
    }
    local_dd0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c48,0);
    Mat::create(in_stack_ffffffffffffe870,(int)((ulong)in_stack_ffffffffffffe868 >> 0x20),
                (int)in_stack_ffffffffffffe868,(size_t)in_stack_ffffffffffffe860,
                (int)((ulong)in_stack_ffffffffffffe858 >> 0x20),in_stack_ffffffffffffe850);
    local_c00 = local_dd0;
    bVar5 = true;
    if (local_dd0->data != (void *)0x0) {
      local_868 = local_dd0;
      bVar5 = local_dd0->cstep * (long)local_dd0->c == 0;
    }
    if (bVar5) {
      return -100;
    }
    for (local_dd4 = 0; local_dd4 < local_da4; local_dd4 = local_dd4 + 1) {
      local_a08 = local_dd0;
      local_a0c = local_dd4;
      local_de0 = (void *)((long)local_dd0->data +
                          (long)local_dd0->w * (long)local_dd4 * local_dd0->elemsize);
      for (local_de8 = 0; uVar6 = local_de8,
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c40), uVar6 < sVar2
          ; local_de8 = local_de8 + 1) {
        local_df0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_c40,local_de8);
        local_b2c = local_dd4;
        local_df8 = (void *)((long)local_df0->data +
                            (long)local_df0->w * (long)local_dd4 * local_df0->elemsize);
        local_b28 = local_df0;
        memcpy(local_de0,local_df8,(long)local_df0->w * local_db0);
        local_de0 = (void *)((long)local_de0 + (long)(local_df0->w * local_db4) * 4);
      }
    }
  }
  if (((local_c54 != 3) && (local_c54 != 4)) || (local_c58 != 0)) goto LAB_001a52bd;
  pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
  local_dfc = pvVar1->w;
  pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
  local_e00 = pvVar1->h;
  pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
  local_e04 = pvVar1->d;
  pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
  local_e10 = pvVar1->elemsize;
  pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
  local_e14 = pvVar1->elempack;
  local_e18 = 0;
  for (local_e20 = 0; uVar6 = local_e20,
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c40), uVar6 < sVar2;
      local_e20 = local_e20 + 1) {
    local_e28 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,local_e20);
    puVar3 = std::min<unsigned_long>(&local_e10,&local_e28->elemsize);
    local_e10 = *puVar3;
    piVar4 = std::min<int>(&local_e14,&local_e28->elempack);
    local_e14 = *piVar4;
    local_e18 = local_e28->c * local_e28->elempack + local_e18;
  }
  local_e2c = 1;
  if (((*(byte *)(local_c50 + 0x27) & 1) != 0) && (local_e2c = 1, local_e18 % 4 == 0)) {
    local_e2c = 4;
  }
  local_e38 = (local_e10 / (ulong)(long)local_e14) * (long)local_e2c;
  local_e40 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c48,0);
  Mat::create(in_stack_ffffffffffffe860,(int)((ulong)in_stack_ffffffffffffe858 >> 0x20),
              (int)in_stack_ffffffffffffe858,(int)((ulong)in_stack_ffffffffffffe850 >> 0x20),
              (int)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848,
              (int)in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8c8);
  local_c08 = local_e40;
  bVar5 = true;
  if (local_e40->data != (void *)0x0) {
    local_860 = local_e40;
    bVar5 = local_e40->cstep * (long)local_e40->c == 0;
  }
  if (bVar5) {
    return -100;
  }
  local_e40->dims = local_c54;
  local_b48 = &local_e88;
  local_b50 = local_e40;
  local_e88 = local_e40->data;
  local_e80 = local_e40->refcount;
  local_e78 = local_e40->elemsize;
  local_e70 = local_e40->elempack;
  local_e68 = local_e40->allocator;
  local_e60 = local_e40->dims;
  local_e5c = local_e40->w;
  local_e58 = local_e40->h;
  local_e54 = local_e40->d;
  local_e50 = local_e40->c;
  local_e48 = local_e40->cstep;
  if (local_e80 != (int *)0x0) {
    local_7fc = 1;
    LOCK();
    local_800 = *local_e80;
    *local_e80 = *local_e80 + 1;
    UNLOCK();
  }
  local_7f8 = local_b48;
  if (local_e14 < local_e2c) {
    Mat::create(in_stack_ffffffffffffe860,(int)((ulong)in_stack_ffffffffffffe858 >> 0x20),
                (int)in_stack_ffffffffffffe858,(int)((ulong)in_stack_ffffffffffffe850 >> 0x20),
                (int)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848,
                (int)in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8c8);
    local_c10 = &local_e88;
    if (local_e88 != (void *)0x0) {
      local_858 = local_c10;
    }
    if (local_e88 != (void *)0x0 && local_e48 * (long)local_e50 != 0) {
      local_e60 = local_c54;
      goto LAB_001a333e;
    }
    local_c2c = -100;
    local_d48 = 1;
  }
  else {
LAB_001a333e:
    local_e8c = 0;
    for (local_e98 = 0; uVar6 = local_e98,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c40), uVar6 < sVar2;
        local_e98 = local_e98 + 1) {
      local_ea0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_c40,local_e98);
      if ((local_ea0->elempack == 4) && (local_e14 == 1)) {
        local_ea4 = local_ea0->w * local_ea0->h * local_ea0->d;
        for (local_ea8 = 0; local_ea8 < local_ea0->c; local_ea8 = local_ea8 + 1) {
          local_990 = &local_ef8;
          local_1d4 = local_ea0->w;
          local_1d8 = local_ea0->h;
          local_1dc = local_ea0->d;
          local_1e8 = (undefined4 *)
                      ((long)local_ea0->data +
                      local_ea0->cstep * (long)local_ea8 * local_ea0->elemsize);
          local_1f0 = local_ea0->elemsize;
          local_1f4 = local_ea0->elempack;
          local_200 = local_ea0->allocator;
          local_1d0 = &local_ef8;
          local_e8 = (long)local_1d4 * (long)local_1d8 * local_1f0;
          local_b78 = &local_ef8;
          local_b00 = &local_ef8;
          local_890 = &local_f48;
          local_898 = &local_e88;
          local_3a8 = (undefined4 *)((long)local_e88 + local_e48 * (long)local_e8c * local_e78);
          local_390 = &local_f48;
          local_68 = (long)local_e5c * (long)local_e58 * local_e78;
          local_ba8 = &local_f48;
          local_af0 = &local_f48;
          local_8bc = local_e8c + 1;
          local_8b0 = &local_f98;
          local_8b8 = &local_e88;
          local_370 = (undefined4 *)((long)local_e88 + local_e48 * (long)local_8bc * local_e78);
          local_358 = &local_f98;
          local_78 = (long)local_e5c * (long)local_e58 * local_e78;
          local_bb0 = &local_f98;
          local_ae0 = &local_f98;
          local_8dc = local_e8c + 2;
          local_8d0 = &local_fe8;
          local_8d8 = &local_e88;
          local_338 = (undefined4 *)((long)local_e88 + local_e48 * (long)local_8dc * local_e78);
          local_320 = &local_fe8;
          local_88 = (long)local_e5c * (long)local_e58 * local_e78;
          local_bb8 = &local_fe8;
          local_ad0 = &local_fe8;
          local_ec0 = 0;
          local_ec4 = 0;
          local_ec8 = 0;
          local_ecc = 0;
          local_ee0 = 0;
          local_ee8 = 0;
          local_ef0 = 0;
          local_ef8 = 0;
          local_f10 = 0;
          local_f14 = 0;
          local_f18 = 0;
          local_f1c = 0;
          local_f28 = local_e68;
          local_f30 = 0;
          local_f38 = 0;
          local_f40 = 0;
          local_f48 = 0;
          local_f60 = 0;
          local_f64 = 0;
          local_f68 = 0;
          local_f6c = 0;
          local_f78 = local_e68;
          local_f80 = 0;
          local_f88 = 0;
          local_f90 = 0;
          local_f98 = 0;
          local_fc8 = local_e68;
          local_6c = 0x10;
          local_7c = 0x10;
          local_8c = 0x10;
          local_ec = 0x10;
          local_324 = local_e5c;
          local_328 = local_e58;
          local_32c = local_e54;
          local_340 = local_e78;
          local_344 = local_e70;
          local_350 = local_e68;
          local_35c = local_e5c;
          local_360 = local_e58;
          local_364 = local_e54;
          local_378 = local_e78;
          local_37c = local_e70;
          local_388 = local_e68;
          local_394 = local_e5c;
          local_398 = local_e58;
          local_39c = local_e54;
          local_3b0 = local_e78;
          local_3b4 = local_e70;
          local_3c0 = local_e68;
          local_89c = local_e8c;
          local_89d = 1;
          local_8bd = 1;
          local_8dd = 1;
          local_99c = local_ea8;
          local_99d = 1;
          local_eb8 = 0;
          local_ed0 = 0;
          local_f08 = 0;
          local_f20 = 0;
          local_f58 = 0;
          local_f70 = 0;
          local_fe8 = 0;
          local_fd8 = 0;
          local_fd0 = 0;
          local_fbc = 0;
          local_fb8 = 0;
          local_fb4 = 0;
          local_fb0 = 0;
          local_fe0 = 0;
          local_8fc = local_e8c + 3;
          local_8f0 = &local_1038;
          local_8f8 = &local_e88;
          local_300 = (undefined4 *)((long)local_e88 + local_e48 * (long)local_8fc * local_e78);
          local_2e8 = &local_1038;
          local_1018 = local_e68;
          local_98 = (long)local_e5c * (long)local_e58 * local_e78;
          local_9c = 0x10;
          local_2ec = local_e5c;
          local_2f0 = local_e58;
          local_2f4 = local_e54;
          local_308 = local_e78;
          local_30c = local_e70;
          local_318 = local_e68;
          local_8fd = 1;
          local_fa8 = 0;
          local_fc0 = 0;
          local_bc0 = &local_1038;
          local_ac0 = &local_1038;
          local_1038 = 0;
          local_1028 = 0;
          local_1020 = 0;
          local_1010 = 0;
          local_100c = 0;
          local_1008 = 0;
          local_1004 = 0;
          local_1000 = 0;
          local_ff8 = 0;
          local_1030 = 0;
          local_ff0 = local_300;
          local_fa0 = local_338;
          local_f50 = local_370;
          local_f00 = local_3a8;
          local_eb0 = local_1e8;
          for (local_103c = 0; local_103c < local_ea4; local_103c = local_103c + 1) {
            *local_f00 = *local_eb0;
            *local_f50 = local_eb0[1];
            *local_fa0 = local_eb0[2];
            *local_ff0 = local_eb0[3];
            local_eb0 = local_eb0 + 4;
            local_ff0 = local_ff0 + 1;
            local_fa0 = local_fa0 + 1;
            local_f50 = local_f50 + 1;
            local_f00 = local_f00 + 1;
          }
          local_e8c = local_e8c + 4;
          local_998 = local_ea0;
          local_5c8 = local_ac0;
          local_5a8 = local_ad0;
          local_588 = local_ae0;
          local_568 = local_af0;
          local_548 = local_b00;
          local_ed8 = local_200;
        }
      }
      if (local_ea0->elempack == local_e14) {
        local_1040 = (int)local_ea0->cstep * local_ea0->c;
        local_1048 = local_ea0->data;
        local_910 = &local_1098;
        local_918 = &local_e88;
        local_1050 = (void *)((long)local_e88 + local_e48 * (long)local_e8c * local_e78);
        local_2b0 = &local_1098;
        local_a8 = (long)local_e5c * (long)local_e58 * local_e78;
        local_bc8 = &local_1098;
        local_ab0 = &local_1098;
        local_1078 = local_e68;
        local_ac = 0x10;
        local_2b4 = local_e5c;
        local_2b8 = local_e58;
        local_2bc = local_e54;
        local_2d0 = local_e78;
        local_2d4 = local_e70;
        local_2e0 = local_e68;
        local_91c = local_e8c;
        local_91d = 1;
        local_1098 = 0;
        local_1088 = 0;
        local_1080 = 0;
        local_1070 = 0;
        local_106c = 0;
        local_1068 = 0;
        local_1064 = 0;
        local_1060 = 0;
        local_1058 = 0;
        local_1090 = 0;
        local_b80 = local_ea0;
        local_838 = local_ea0;
        local_5e8 = local_ab0;
        local_2c8 = local_1050;
        memcpy(local_1050,local_1048,(long)local_1040 * local_ea0->elemsize);
        local_e8c = local_ea0->c + local_e8c;
      }
    }
    if (local_e14 < local_e2c) {
      convert_packing(in_stack_ffffffffffffe880,in_stack_ffffffffffffe878,
                      (int)((ulong)in_stack_ffffffffffffe870 >> 0x20),in_stack_ffffffffffffe868);
    }
    local_d48 = 0;
  }
  local_aa0 = &local_e88;
  local_608 = local_aa0;
  if (local_e80 != (int *)0x0) {
    local_60c = 0xffffffff;
    LOCK();
    local_610 = *local_e80;
    *local_e80 = *local_e80 + -1;
    UNLOCK();
    if (local_610 == 1) {
      if (local_e68 == (Allocator *)0x0) {
        local_4b0 = local_e88;
        if (local_e88 != (void *)0x0) {
          free(local_e88);
        }
      }
      else {
        (*local_e68->_vptr_Allocator[3])(local_e68,local_e88);
      }
    }
  }
  local_e88 = (void *)0x0;
  local_e78 = 0;
  local_e70 = 0;
  local_e60 = 0;
  local_e5c = 0;
  local_e58 = 0;
  local_e54 = 0;
  local_e50 = 0;
  local_e48 = 0;
  local_e80 = (int *)0x0;
  if (local_d48 != 0) {
    return local_c2c;
  }
LAB_001a52bd:
  if (((local_c54 == 3) && (local_c58 == 1)) || ((local_c54 == 4 && (local_c58 == 2)))) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_109c = pvVar1->w;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_10a0 = pvVar1->d;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_10a4 = pvVar1->c;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_10b0 = pvVar1->elemsize;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_10b4 = pvVar1->elempack;
    local_10b8 = 0;
    for (local_10c0 = 0; uVar6 = local_10c0,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c40), uVar6 < sVar2;
        local_10c0 = local_10c0 + 1) {
      local_10c8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             (local_c40,local_10c0);
      local_10b8 = local_10c8->h + local_10b8;
    }
    local_10d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c48,0);
    Mat::create(in_stack_ffffffffffffe860,(int)((ulong)in_stack_ffffffffffffe858 >> 0x20),
                (int)in_stack_ffffffffffffe858,(int)((ulong)in_stack_ffffffffffffe850 >> 0x20),
                (int)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848,
                (int)in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8c8);
    local_c18 = local_10d0;
    bVar5 = true;
    if (local_10d0->data != (void *)0x0) {
      local_850 = local_10d0;
      bVar5 = local_10d0->cstep * (long)local_10d0->c == 0;
    }
    if (bVar5) {
      return -100;
    }
    local_10d0->dims = local_c54;
    for (local_10d4 = 0; local_10d4 < local_10a4; local_10d4 = local_10d4 + 1) {
      local_930 = &local_1128;
      local_27c = local_10d0->w;
      local_280 = local_10d0->h;
      local_284 = local_10d0->d;
      local_10e0 = (void *)((long)local_10d0->data +
                           local_10d0->cstep * (long)local_10d4 * local_10d0->elemsize);
      local_298 = local_10d0->elemsize;
      local_29c = local_10d0->elempack;
      local_2a8 = local_10d0->allocator;
      local_278 = &local_1128;
      local_b8 = (long)local_27c * (long)local_280 * local_298;
      local_bd0 = &local_1128;
      local_a90 = &local_1128;
      local_bc = 0x10;
      local_938 = local_10d0;
      local_93c = local_10d4;
      local_93d = 1;
      local_1128 = 0;
      local_1118 = 0;
      local_1110 = 0;
      local_1100 = 0;
      local_10fc = 0;
      local_10f8 = 0;
      local_10f4 = 0;
      local_10f0 = 0;
      local_10e8 = 0;
      local_1120 = 0;
      local_628 = local_a90;
      local_290 = local_10e0;
      local_1108 = local_2a8;
      for (local_112c = 0; local_112c < local_10a0; local_112c = local_112c + 1) {
        for (local_1138 = 0; uVar6 = local_1138,
            sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c40),
            uVar6 < sVar2; local_1138 = local_1138 + 1) {
          local_1140 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_c40,local_1138);
          local_1144 = local_1140->w * local_1140->h;
          local_9b0 = &local_11e0;
          local_19c = local_1140->w;
          local_1a0 = local_1140->h;
          local_1a4 = local_1140->d;
          local_1b0 = (void *)((long)local_1140->data +
                              local_1140->cstep * (long)local_10d4 * local_1140->elemsize);
          local_1b8 = local_1140->elemsize;
          local_1bc = local_1140->elempack;
          local_1c8 = local_1140->allocator;
          local_198 = &local_11e0;
          local_f8 = (long)local_19c * (long)local_1a0 * local_1b8;
          local_808 = &local_1198;
          local_810 = &local_11e0;
          local_1150 = (void *)((long)local_1b0 +
                               (long)local_19c * (long)local_1a0 * (long)local_112c * local_1b8);
          local_38 = &local_1198;
          local_b88 = &local_1198;
          local_a80 = &local_1198;
          local_a70 = &local_11e0;
          local_1158 = 0;
          local_1160 = 0;
          local_1164 = 0;
          local_1168 = 0;
          local_116c = 0;
          local_1170 = 0;
          local_1180 = 0;
          local_1188 = 0;
          local_1190 = 0;
          local_1198 = 0;
          local_fc = 0x10;
          local_814 = local_112c;
          local_9bc = local_10d4;
          local_9bd = 1;
          local_11e0 = 0;
          local_11d0 = 0;
          local_11c8 = 0;
          local_11b8 = 0;
          local_11b4 = 0;
          local_11b0 = 0;
          local_11ac = 0;
          local_11a8 = 0;
          local_11a0 = 0;
          local_11d8 = 0;
          local_9b8 = local_1140;
          local_668 = local_a70;
          local_648 = local_a80;
          local_60 = local_1c8;
          local_54 = local_1bc;
          local_50 = local_1b8;
          local_48 = local_1150;
          local_40 = local_1a0;
          local_3c = local_19c;
          local_11c0 = local_1c8;
          local_1178 = local_1c8;
          memcpy(local_10e0,local_1150,(long)local_1144 * local_10b0);
          local_10e0 = (void *)((long)local_10e0 + (long)(local_1144 * local_10b4) * 4);
        }
      }
    }
  }
  if (((local_c54 == 3) && (local_c58 == 2)) || ((local_c54 == 4 && (local_c58 == 3)))) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_11e4 = pvVar1->h;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_11e8 = pvVar1->d;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_11ec = pvVar1->c;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_11f8 = pvVar1->elemsize;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_11fc = pvVar1->elempack;
    local_1200 = 0;
    for (local_1208 = 0; uVar6 = local_1208,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c40), uVar6 < sVar2;
        local_1208 = local_1208 + 1) {
      local_1210 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             (local_c40,local_1208);
      local_1200 = local_1210->w + local_1200;
    }
    local_1218 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c48,0);
    Mat::create(in_stack_ffffffffffffe860,(int)((ulong)in_stack_ffffffffffffe858 >> 0x20),
                (int)in_stack_ffffffffffffe858,(int)((ulong)in_stack_ffffffffffffe850 >> 0x20),
                (int)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848,
                (int)in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8c8);
    local_c20 = local_1218;
    bVar5 = true;
    if (local_1218->data != (void *)0x0) {
      local_848 = local_1218;
      bVar5 = local_1218->cstep * (long)local_1218->c == 0;
    }
    if (bVar5) {
      return -100;
    }
    local_1218->dims = local_c54;
    for (local_121c = 0; local_121c < local_11ec; local_121c = local_121c + 1) {
      local_950 = &local_1270;
      local_244 = local_1218->w;
      local_248 = local_1218->h;
      local_24c = local_1218->d;
      local_1228 = (void *)((long)local_1218->data +
                           local_1218->cstep * (long)local_121c * local_1218->elemsize);
      local_260 = local_1218->elemsize;
      local_264 = local_1218->elempack;
      local_270 = local_1218->allocator;
      local_240 = &local_1270;
      local_c8 = (long)local_244 * (long)local_248 * local_260;
      local_bd8 = &local_1270;
      local_a60 = &local_1270;
      local_cc = 0x10;
      local_958 = local_1218;
      local_95c = local_121c;
      local_95d = 1;
      local_1270 = 0;
      local_1260 = 0;
      local_1258 = 0;
      local_1248 = 0;
      local_1244 = 0;
      local_1240 = 0;
      local_123c = 0;
      local_1238 = 0;
      local_1230 = 0;
      local_1268 = 0;
      local_688 = local_a60;
      local_258 = local_1228;
      local_1250 = local_270;
      for (local_1274 = 0; local_1274 < local_11e8; local_1274 = local_1274 + 1) {
        for (local_1278 = 0; local_1278 < local_11e4; local_1278 = local_1278 + 1) {
          for (local_1280 = 0; uVar6 = local_1280,
              sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c40),
              uVar6 < sVar2; local_1280 = local_1280 + 1) {
            local_1288 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                   (local_c40,local_1280);
            local_9d0 = &local_1320;
            local_164 = local_1288->w;
            local_168 = local_1288->h;
            local_16c = local_1288->d;
            local_178 = (void *)((long)local_1288->data +
                                local_1288->cstep * (long)local_121c * local_1288->elemsize);
            local_180 = local_1288->elemsize;
            local_184 = local_1288->elempack;
            local_190 = local_1288->allocator;
            local_160 = &local_1320;
            local_108 = (long)local_164 * (long)local_168 * local_180;
            local_820 = &local_12d8;
            local_828 = &local_1320;
            local_18 = (void *)((long)local_178 +
                               (long)local_164 * (long)local_168 * (long)local_1274 * local_180);
            local_8 = &local_12d8;
            local_b38 = &local_12d8;
            in_stack_ffffffffffffe8c8 =
                 (Allocator *)((long)local_18 + (long)local_164 * (long)local_1278 * local_180);
            in_stack_ffffffffffffe8c0 = &local_12d8;
            local_a40 = &local_1320;
            local_1298 = 0;
            local_12a0 = 0;
            local_12a4 = 0;
            local_12a8 = 0;
            local_12ac = 0;
            local_12b0 = 0;
            local_12c0 = 0;
            local_12c8 = 0;
            local_12d0 = 0;
            local_12d8 = 0;
            local_10c = 0x10;
            local_82c = local_1274;
            local_9dc = local_121c;
            local_9dd = 1;
            local_b3c = local_1278;
            local_1320 = 0;
            local_1310 = 0;
            local_1308 = 0;
            local_12f8 = 0;
            local_12f4 = 0;
            local_12f0 = 0;
            local_12ec = 0;
            local_12e8 = 0;
            local_12e0 = 0;
            local_1318 = 0;
            local_1290 = in_stack_ffffffffffffe8c8;
            local_a50 = in_stack_ffffffffffffe8c0;
            local_9d8 = local_1288;
            local_6c8 = local_a40;
            local_6a8 = in_stack_ffffffffffffe8c0;
            local_30 = local_190;
            local_24 = local_184;
            local_20 = local_180;
            local_10 = local_168;
            local_c = local_164;
            local_1300 = local_190;
            local_12b8 = local_190;
            memcpy(local_1228,in_stack_ffffffffffffe8c8,(long)local_1288->w * local_11f8);
            local_1228 = (void *)((long)local_1228 + (long)(local_1288->w * local_11fc) * 4);
          }
        }
      }
    }
  }
  if ((local_c54 == 4) && (local_c58 == 1)) {
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_1324 = pvVar1->w;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_1328 = pvVar1->h;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_132c = pvVar1->c;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_1338 = pvVar1->elemsize;
    pvVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c40,0);
    local_133c = pvVar1->elempack;
    local_1340 = 0;
    local_1348 = 0;
    while( true ) {
      uVar6 = local_1348;
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c40);
      _elempack = (int)in_stack_ffffffffffffe8c0;
      if (sVar2 <= uVar6) break;
      local_1350 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             (local_c40,local_1348);
      local_1340 = local_1350->d + local_1340;
      local_1348 = local_1348 + 1;
    }
    local_1358 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_c48,0);
    Mat::create(in_stack_ffffffffffffe860,(int)((ulong)in_stack_ffffffffffffe858 >> 0x20),
                (int)in_stack_ffffffffffffe858,(int)((ulong)in_stack_ffffffffffffe850 >> 0x20),
                (int)in_stack_ffffffffffffe850,in_stack_ffffffffffffe848,_elempack,
                in_stack_ffffffffffffe8c8);
    local_c28 = local_1358;
    bVar5 = true;
    if (local_1358->data != (void *)0x0) {
      local_840 = local_1358;
      bVar5 = local_1358->cstep * (long)local_1358->c == 0;
    }
    if (bVar5) {
      return -100;
    }
    for (local_135c = 0; local_135c < local_132c; local_135c = local_135c + 1) {
      local_970 = &local_13b0;
      local_20c = local_1358->w;
      local_210 = local_1358->h;
      local_214 = local_1358->d;
      local_1368 = (void *)((long)local_1358->data +
                           local_1358->cstep * (long)local_135c * local_1358->elemsize);
      local_228 = local_1358->elemsize;
      local_22c = local_1358->elempack;
      local_238 = local_1358->allocator;
      local_208 = &local_13b0;
      local_d8 = (long)local_20c * (long)local_210 * local_228;
      local_be0 = &local_13b0;
      local_a30 = &local_13b0;
      local_dc = 0x10;
      local_978 = local_1358;
      local_97c = local_135c;
      local_97d = 1;
      local_13b0 = 0;
      local_13a0 = 0;
      local_1398 = 0;
      local_1388 = 0;
      local_1384 = 0;
      local_1380 = 0;
      local_137c = 0;
      local_1378 = 0;
      local_1370 = 0;
      local_13a8 = 0;
      local_13b8 = 0;
      local_6e8 = local_a30;
      local_220 = local_1368;
      local_1390 = local_238;
      while (uVar6 = local_13b8,
            sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_c40),
            uVar6 < sVar2) {
        local_13c0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_c40,local_13b8);
        local_13c4 = local_13c0->w * local_13c0->h * local_13c0->d;
        local_9f0 = &local_1418;
        local_12c = local_13c0->w;
        local_130 = local_13c0->h;
        local_134 = local_13c0->d;
        local_13d0 = (void *)((long)local_13c0->data +
                             local_13c0->cstep * (long)local_135c * local_13c0->elemsize);
        local_148 = local_13c0->elemsize;
        local_14c = local_13c0->elempack;
        local_158 = local_13c0->allocator;
        local_128 = &local_1418;
        local_118 = (long)local_12c * (long)local_130 * local_148;
        local_b90 = &local_1418;
        local_a20 = &local_1418;
        local_11c = 0x10;
        local_9fc = local_135c;
        local_9fd = 1;
        local_1418 = 0;
        local_1408 = 0;
        local_1400 = 0;
        local_13f0 = 0;
        local_13ec = 0;
        local_13e8 = 0;
        local_13e4 = 0;
        local_13e0 = 0;
        local_13d8 = 0;
        local_1410 = 0;
        local_9f8 = local_13c0;
        local_708 = local_a20;
        local_140 = local_13d0;
        local_13f8 = local_158;
        memcpy(local_1368,local_13d0,(long)local_13c4 * local_1338);
        local_1368 = (void *)((long)local_1368 + (long)(local_13c4 * local_133c) * 4);
        local_13b8 = local_13b8 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int Concat_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_w % 16 == 0 ? 16 : top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_w % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, bottom_blob.w * bottom_blob.elemsize);

            outptr += bottom_blob.w * bottom_blob.elempack;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_h += bottom_blob.h * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_h % 16 == 0 ? 16 : top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, top_h / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        float* outptr = top_blob_unpacked;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 8;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;
                    float* outptr2 = outptr + w * 8;
                    float* outptr3 = outptr + w * 12;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;
                    float* outptr8 = outptr + w * 8;
                    float* outptr9 = outptr + w * 9;
                    float* outptra = outptr + w * 10;
                    float* outptrb = outptr + w * 11;
                    float* outptrc = outptr + w * 12;
                    float* outptrd = outptr + w * 13;
                    float* outptre = outptr + w * 14;
                    float* outptrf = outptr + w * 15;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    outptr += w * 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8 16-16
            {
                int size = w * bottom_blob.h;

                const float* ptr = bottom_blob;
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                outptr += size * bottom_blob.elempack;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elempack;
            }
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;

        // total channels
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_channels += bottom_blob.c * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_channels % 16 == 0 ? 16 : top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, d, top_channels / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, h, d, top_channels / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;

            top_blob_unpacked.dims = dims;
        }

        int p = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);
                    float* outptr8 = top_blob_unpacked.channel(p + 8);
                    float* outptr9 = top_blob_unpacked.channel(p + 9);
                    float* outptra = top_blob_unpacked.channel(p + 10);
                    float* outptrb = top_blob_unpacked.channel(p + 11);
                    float* outptrc = top_blob_unpacked.channel(p + 12);
                    float* outptrd = top_blob_unpacked.channel(p + 13);
                    float* outptre = top_blob_unpacked.channel(p + 14);
                    float* outptrf = top_blob_unpacked.channel(p + 15);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = bottom_blob.total();

                const float* ptr = bottom_blob;
                float* outptr = top_blob_unpacked.channel(p);
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                p += bottom_blob.c;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, d, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    int size = bottom_blob.w * bottom_blob.h;

                    const float* ptr = bottom_blob.channel(q).depth(i);
                    memcpy(outptr, ptr, size * elemsize);

                    outptr += size * elempack;
                }
            }
        }
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, d, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    for (size_t b = 0; b < bottom_blobs.size(); b++)
                    {
                        const Mat& bottom_blob = bottom_blobs[b];

                        const float* ptr = bottom_blob.channel(q).depth(i).row(j);
                        memcpy(outptr, ptr, bottom_blob.w * elemsize);

                        outptr += bottom_blob.w * elempack;
                    }
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        // interleave dim depth
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total depth
        int top_d = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_d += bottom_blob.d;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_d, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elempack;
            }
        }
    }

    return 0;
}